

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O2

void __thiscall
Table_TableCannotBeMultiline3_Test::Table_TableCannotBeMultiline3_Test
          (Table_TableCannotBeMultiline3_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001af288;
  return;
}

Assistant:

TEST(Table, TableCannotBeMultiline3) {
    std::istringstream input("[table.123\n.\"table\\ntable\"]");
    events_aggregator_t handler;

    try {
        loltoml::parse(input, handler);
        FAIL();
    } catch (const loltoml::parser_error_t &e) {
        EXPECT_EQ(10, e.offset());
    }
}